

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageView.cpp
# Opt level: O0

Ptr<ImageView> myvk::ImageView::Create(Ptr<SwapchainImage> *swapchain_image)

{
  element_type *this;
  element_type *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  Ptr<ImageView> PVar1;
  uint32_t unaff_retaddr;
  uint32_t in_stack_00000008;
  uint32_t in_stack_00000010;
  VkComponentMapping *in_stack_00000018;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  uint32_t in_stack_ffffffffffffffd8;
  VkImageAspectFlags in_stack_ffffffffffffffdc;
  VkFormat in_stack_ffffffffffffffe0;
  VkImageViewType in_stack_ffffffffffffffe4;
  Ptr<ImageBase> *in_stack_ffffffffffffffe8;
  
  std::shared_ptr<myvk::ImageBase>::shared_ptr<myvk::SwapchainImage,void>
            ((shared_ptr<myvk::ImageBase> *)
             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
             (shared_ptr<myvk::SwapchainImage> *)
             CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  this = std::__shared_ptr_access<myvk::SwapchainImage,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<myvk::SwapchainImage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)0x2a02da);
  SwapchainImage::GetSwapchainPtr(this);
  this_00 = std::__shared_ptr_access<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x2a02f3);
  Swapchain::GetImageFormat(this_00);
  Create(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0,
         in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8,unaff_retaddr,in_stack_00000008,
         in_stack_00000010,in_stack_00000018);
  std::shared_ptr<myvk::ImageBase>::~shared_ptr((shared_ptr<myvk::ImageBase> *)0x2a036c);
  PVar1.super___shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar1.super___shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (Ptr<ImageView>)PVar1.super___shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ptr<ImageView> ImageView::Create(const Ptr<SwapchainImage> &swapchain_image) {
	return Create(swapchain_image, VK_IMAGE_VIEW_TYPE_2D, swapchain_image->GetSwapchainPtr()->GetImageFormat(),
	              VK_IMAGE_ASPECT_COLOR_BIT);
}